

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ParseHelper.cpp
# Opt level: O0

void __thiscall
glslang::TParseContext::setLayoutQualifier
          (TParseContext *this,TSourceLoc *loc,TPublicType *publicType,TString *id,
          TIntermTyped *node)

{
  bool bVar1;
  bool bVar2;
  int iVar3;
  uint uVar4;
  undefined4 extraout_var;
  TConstUnionArray *this_01;
  TConstUnion *this_02;
  iterator __first;
  iterator __last;
  iterator __result;
  size_type sVar5;
  char *pcVar6;
  int local_1bc;
  int local_1ac;
  pool_allocator<char> local_138;
  undefined1 local_130 [8];
  TString maxsErrtring_1;
  int max_1;
  undefined1 local_f8 [8];
  TString maxsErrtring;
  char *pcStack_c8;
  int max;
  char *exts_2 [2];
  char *feature_3;
  char *exts_1 [2];
  char *feature_2;
  char *exts [2];
  char *feature_1;
  uint local_4c;
  bool nonLiteral;
  int value;
  TIntermConstantUnion *constUnion;
  char *nonLiteralFeature;
  char *feature;
  TIntermTyped *node_local;
  TString *id_local;
  TPublicType *publicType_local;
  TSourceLoc *loc_local;
  TParseContext *this_local;
  TIntermConstantUnion *this_00;
  
  integerCheck(this,node,"layout-id value");
  iVar3 = (*(node->super_TIntermNode)._vptr_TIntermNode[0x11])();
  this_00 = (TIntermConstantUnion *)CONCAT44(extraout_var,iVar3);
  bVar2 = false;
  if (this_00 == (TIntermConstantUnion *)0x0) {
    local_4c = 0;
    bVar2 = true;
  }
  else {
    this_01 = TIntermConstantUnion::getConstArray(this_00);
    this_02 = TConstUnionArray::operator[](this_01,0);
    local_4c = TConstUnion::getIConst(this_02);
    bVar1 = TIntermConstantUnion::isLiteral(this_00);
    if (!bVar1) {
      TParseVersions::requireProfile((TParseVersions *)this,loc,6,"non-literal layout-id value");
      TParseVersions::profileRequires
                ((TParseVersions *)this,loc,6,0x1b8,"GL_ARB_enhanced_layouts",
                 "non-literal layout-id value");
    }
  }
  if ((int)local_4c < 0) {
    (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2d])
              (this,loc,"cannot be negative","layout-id value","");
    return;
  }
  __first = std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>
            ::begin(id);
  __last = std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>
           ::end(id);
  __result = std::__cxx11::
             basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::begin(id);
  std::
  transform<__gnu_cxx::__normal_iterator<char*,std::__cxx11::basic_string<char,std::char_traits<char>,glslang::std::allocator<char>>>,__gnu_cxx::__normal_iterator<char*,std::__cxx11::basic_string<char,std::char_traits<char>,glslang::std::allocator<char>>>,int(*)(int)noexcept>
            ((__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>_>
              )__first._M_current,
             (__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>_>
              )__last._M_current,
             (__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>_>
              )__result._M_current,tolower);
  bVar1 = std::operator==(id,"offset");
  if (bVar1) {
    exts[1] = "offset";
    if ((this->super_TParseContextBase).super_TParseVersions.spvVersion.spv == 0) {
      TParseVersions::requireProfile((TParseVersions *)this,loc,0xe,"offset");
      feature_2 = "GL_ARB_enhanced_layouts";
      exts[0] = "GL_ARB_shader_atomic_counters";
      TParseVersions::profileRequires((TParseVersions *)this,loc,6,0x1a4,2,&feature_2,exts[1]);
      TParseVersions::profileRequires((TParseVersions *)this,loc,8,0x136,(char *)0x0,exts[1]);
    }
    (publicType->qualifier).layoutOffset = local_4c;
    *(ulong *)&(publicType->qualifier).field_0x8 =
         *(ulong *)&(publicType->qualifier).field_0x8 & 0xfffffffbffffffff | 0x400000000;
    if (!bVar2) {
      return;
    }
    (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2d])
              (this,loc,"needs a literal integer","offset","");
    return;
  }
  bVar1 = std::operator==(id,"align");
  if (bVar1) {
    if ((this->super_TParseContextBase).super_TParseVersions.spvVersion.spv == 0) {
      TParseVersions::requireProfile((TParseVersions *)this,loc,6,"uniform buffer-member align");
      TParseVersions::profileRequires
                ((TParseVersions *)this,loc,6,0x1b8,"GL_ARB_enhanced_layouts",
                 "uniform buffer-member align");
    }
    bVar1 = IsPow2<int>(local_4c);
    if (bVar1) {
      (publicType->qualifier).layoutAlign = local_4c;
    }
    else {
      (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2d])
                (this,loc,"must be a power of 2","align","");
    }
    if (!bVar2) {
      return;
    }
    (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2d])
              (this,loc,"needs a literal integer","align","");
    return;
  }
  bVar1 = std::operator==(id,"location");
  if (bVar1) {
    TParseVersions::profileRequires((TParseVersions *)this,loc,8,300,(char *)0x0,"location");
    feature_3 = "GL_ARB_separate_shader_objects";
    exts_1[0] = "GL_ARB_explicit_attrib_location";
    TParseVersions::profileRequires((TParseVersions *)this,loc,-9,0x14a,2,&feature_3,"location");
    if (local_4c < 0xfff) {
      *(ulong *)&(publicType->qualifier).field_0x1c =
           *(ulong *)&(publicType->qualifier).field_0x1c & 0xfffffffffffff000 |
           (ulong)local_4c & 0xfff;
    }
    else {
      pcVar6 = std::__cxx11::
               basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::c_str(id)
      ;
      (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2d])
                (this,loc,"location is too large",pcVar6,"");
    }
    if (!bVar2) {
      return;
    }
    (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2d])
              (this,loc,"needs a literal integer","location","");
    return;
  }
  bVar1 = std::operator==(id,"set");
  if (bVar1) {
    if (local_4c < 0x3f) {
      *(ulong *)&(publicType->qualifier).field_0x1c =
           *(ulong *)&(publicType->qualifier).field_0x1c & 0xffffffffffc07fff |
           ((ulong)local_4c & 0x7f) << 0xf;
    }
    else {
      pcVar6 = std::__cxx11::
               basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::c_str(id)
      ;
      (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2d])
                (this,loc,"set is too large",pcVar6,"");
    }
    if (local_4c != 0) {
      (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2a])
                (this,loc,"descriptor set");
    }
    if (!bVar2) {
      return;
    }
    (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2d])
              (this,loc,"needs a literal integer","set","");
    return;
  }
  bVar1 = std::operator==(id,"binding");
  if (bVar1) {
    TParseVersions::profileRequires
              ((TParseVersions *)this,loc,-9,0x1a4,"GL_ARB_shading_language_420pack","binding");
    TParseVersions::profileRequires((TParseVersions *)this,loc,8,0x136,(char *)0x0,"binding");
    if (local_4c < 0xffff) {
      *(ulong *)&(publicType->qualifier).field_0x1c =
           *(ulong *)&(publicType->qualifier).field_0x1c & 0xffff0000ffffffff |
           ((ulong)local_4c & 0xffff) << 0x20;
    }
    else {
      pcVar6 = std::__cxx11::
               basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::c_str(id)
      ;
      (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2d])
                (this,loc,"binding is too large",pcVar6,"");
    }
    if (!bVar2) {
      return;
    }
    (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2d])
              (this,loc,"needs a literal integer","binding","");
    return;
  }
  bVar1 = std::operator==(id,"constant_id");
  if (bVar1) {
    (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2b])
              (this,loc,"constant_id");
    if ((int)local_4c < 0x7ff) {
      *(ulong *)&(publicType->qualifier).field_0x24 =
           *(ulong *)&(publicType->qualifier).field_0x24 & 0xfff800ffffffffff |
           ((ulong)local_4c & 0x7ff) << 0x28;
      *(ulong *)&(publicType->qualifier).field_0x8 =
           *(ulong *)&(publicType->qualifier).field_0x8 & 0xfffffffeffffffff | 0x100000000;
      bVar1 = TIntermediate::addUsedConstantId
                        ((this->super_TParseContextBase).super_TParseVersions.intermediate,local_4c)
      ;
      if (!bVar1) {
        pcVar6 = std::__cxx11::
                 basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::c_str
                           (id);
        (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2d])
                  (this,loc,"specialization-constant id already used",pcVar6,"");
      }
    }
    else {
      pcVar6 = std::__cxx11::
               basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::c_str(id)
      ;
      (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2d])
                (this,loc,"specialization-constant id is too large",pcVar6,"");
    }
    if (!bVar2) {
      return;
    }
    (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2d])
              (this,loc,"needs a literal integer","constant_id","");
    return;
  }
  bVar1 = std::operator==(id,"component");
  if (bVar1) {
    TParseVersions::requireProfile((TParseVersions *)this,loc,6,"component");
    TParseVersions::profileRequires
              ((TParseVersions *)this,loc,6,0x1b8,"GL_ARB_enhanced_layouts","component");
    if (local_4c < 4) {
      *(ulong *)&(publicType->qualifier).field_0x1c =
           *(ulong *)&(publicType->qualifier).field_0x1c & 0xffffffffffff8fff |
           ((ulong)local_4c & 7) << 0xc;
    }
    else {
      pcVar6 = std::__cxx11::
               basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::c_str(id)
      ;
      (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2d])
                (this,loc,"component is too large",pcVar6,"");
    }
    if (!bVar2) {
      return;
    }
    (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2d])
              (this,loc,"needs a literal integer","component","");
    return;
  }
  iVar3 = std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::
          compare(id,0,4,"xfb_");
  if (iVar3 == 0) {
    TIntermediate::setXfbMode((this->super_TParseContextBase).super_TParseVersions.intermediate);
    TParseVersions::requireStage
              ((TParseVersions *)this,loc,
               EShLangGeometryMask|EShLangTessEvaluationMask|EShLangTessControlMask|
               EShLangVertexMask,"transform feedback qualifier");
    TParseVersions::requireProfile((TParseVersions *)this,loc,6,"transform feedback qualifier");
    TParseVersions::profileRequires
              ((TParseVersions *)this,loc,6,0x1b8,"GL_ARB_enhanced_layouts",
               "transform feedback qualifier");
    bVar1 = std::operator==(id,"xfb_buffer");
    if (bVar1) {
      if ((this->resources).maxTransformFeedbackBuffers <= (int)local_4c) {
        pcVar6 = std::__cxx11::
                 basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::c_str
                           (id);
        (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2d])
                  (this,loc,"buffer is too large:",pcVar6,"gl_MaxTransformFeedbackBuffers is %d",
                   (ulong)(uint)(this->resources).maxTransformFeedbackBuffers);
      }
      if ((int)local_4c < 0xf) {
        *(ulong *)&(publicType->qualifier).field_0x24 =
             *(ulong *)&(publicType->qualifier).field_0x24 & 0xfffffffffffffff0 |
             (ulong)local_4c & 0xf;
      }
      else {
        pcVar6 = std::__cxx11::
                 basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::c_str
                           (id);
        (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2d])
                  (this,loc,"buffer is too large:",pcVar6,"internal max is %d",0xe);
      }
      if (!bVar2) {
        return;
      }
      (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2d])
                (this,loc,"needs a literal integer","xfb_buffer","");
      return;
    }
    bVar1 = std::operator==(id,"xfb_offset");
    if (bVar1) {
      if ((int)local_4c < 0x1fff) {
        *(ulong *)&(publicType->qualifier).field_0x24 =
             *(ulong *)&(publicType->qualifier).field_0x24 & 0xffffffff8003ffff |
             ((ulong)local_4c & 0x1fff) << 0x12;
      }
      else {
        pcVar6 = std::__cxx11::
                 basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::c_str
                           (id);
        (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2d])
                  (this,loc,"offset is too large:",pcVar6,"internal max is %d",0x1ffe);
      }
      if (!bVar2) {
        return;
      }
      (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2d])
                (this,loc,"needs a literal integer","xfb_offset","");
      return;
    }
    bVar1 = std::operator==(id,"xfb_stride");
    if (bVar1) {
      if ((this->resources).maxTransformFeedbackInterleavedComponents * 4 < (int)local_4c) {
        pcVar6 = std::__cxx11::
                 basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::c_str
                           (id);
        (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2d])
                  (this,loc,"1/4 stride is too large:",pcVar6,
                   "gl_MaxTransformFeedbackInterleavedComponents is %d",
                   (ulong)(uint)(this->resources).maxTransformFeedbackInterleavedComponents);
      }
      if ((int)local_4c < 0x3fff) {
        *(ulong *)&(publicType->qualifier).field_0x24 =
             *(ulong *)&(publicType->qualifier).field_0x24 & 0xfffffffffffc000f |
             ((ulong)local_4c & 0x3fff) << 4;
      }
      else {
        pcVar6 = std::__cxx11::
                 basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::c_str
                           (id);
        (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2d])
                  (this,loc,"stride is too large:",pcVar6,"internal max is %d",0x3ffe);
      }
      if (!bVar2) {
        return;
      }
      (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2d])
                (this,loc,"needs a literal integer","xfb_stride","");
      return;
    }
  }
  bVar1 = std::operator==(id,"input_attachment_index");
  if (bVar1) {
    (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2a])
              (this,loc,"input_attachment_index");
    if ((int)local_4c < 0xff) {
      *(ulong *)&(publicType->qualifier).field_0x24 =
           *(ulong *)&(publicType->qualifier).field_0x24 & 0xffffff00ffffffff |
           ((ulong)local_4c & 0xff) << 0x20;
    }
    else {
      pcVar6 = std::__cxx11::
               basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::c_str(id)
      ;
      (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2d])
                (this,loc,"attachment index is too large",pcVar6,"");
    }
    if (!bVar2) {
      return;
    }
    (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2d])
              (this,loc,"needs a literal integer","input_attachment_index","");
    return;
  }
  bVar1 = std::operator==(id,"num_views");
  if (bVar1) {
    (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[5])
              (this,loc,2,OVR_multiview_EXTs,"num_views");
    (publicType->shaderQualifiers).numViews = local_4c;
    if (!bVar2) {
      return;
    }
    (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2d])
              (this,loc,"needs a literal integer","num_views","");
    return;
  }
  if ((((((this->super_TParseContextBase).super_TParseVersions.language == EShLangVertex) ||
        ((this->super_TParseContextBase).super_TParseVersions.language == EShLangTessControl)) ||
       ((this->super_TParseContextBase).super_TParseVersions.language == EShLangTessEvaluation)) ||
      ((this->super_TParseContextBase).super_TParseVersions.language == EShLangGeometry)) &&
     (bVar1 = std::operator==(id,"secondary_view_offset"), bVar1)) {
    (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[5])
              (this,loc,1,&E_GL_NV_stereo_view_rendering,"stereo view rendering");
    (publicType->qualifier).layoutSecondaryViewportRelativeOffset = local_4c;
    if (!bVar2) {
      return;
    }
    (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2d])
              (this,loc,"needs a literal integer","secondary_view_offset","");
    return;
  }
  bVar1 = std::operator==(id,"buffer_reference_align");
  if (bVar1) {
    (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[5])
              (this,loc,1,&E_GL_EXT_buffer_reference,"buffer_reference_align");
    bVar1 = IsPow2<int>(local_4c);
    if (bVar1) {
      uVar4 = IntLog2<int>(local_4c);
      *(ulong *)&(publicType->qualifier).field_0x24 =
           *(ulong *)&(publicType->qualifier).field_0x24 & 0xfe07ffffffffffff |
           ((ulong)uVar4 & 0x3f) << 0x33;
    }
    else {
      (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2d])
                (this,loc,"must be a power of 2","buffer_reference_align","");
    }
    if (!bVar2) {
      return;
    }
    (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2d])
              (this,loc,"needs a literal integer","buffer_reference_align","");
    return;
  }
  switch((this->super_TParseContextBase).super_TParseVersions.language) {
  case EShLangTessControl:
    bVar1 = std::operator==(id,"vertices");
    if (bVar1) {
      if (local_4c == 0) {
        (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2d])
                  (this,loc,"must be greater than 0","vertices","");
      }
      else {
        (publicType->shaderQualifiers).vertices = local_4c;
      }
      if (!bVar2) {
        return;
      }
      (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2d])
                (this,loc,"needs a literal integer","vertices","");
      return;
    }
    break;
  default:
    break;
  case EShLangGeometry:
    bVar1 = std::operator==(id,"invocations");
    if (bVar1) {
      TParseVersions::profileRequires((TParseVersions *)this,loc,6,400,(char *)0x0,"invocations");
      if (local_4c == 0) {
        (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2d])
                  (this,loc,"must be at least 1","invocations","");
      }
      else {
        (publicType->shaderQualifiers).invocations = local_4c;
      }
      if (!bVar2) {
        return;
      }
      (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2d])
                (this,loc,"needs a literal integer","invocations","");
      return;
    }
    bVar1 = std::operator==(id,"max_vertices");
    if (bVar1) {
      (publicType->shaderQualifiers).vertices = local_4c;
      if ((this->resources).maxGeometryOutputVertices < (int)local_4c) {
        (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2d])
                  (this,loc,"too large, must be less than gl_MaxGeometryOutputVertices",
                   "max_vertices","");
      }
      if (!bVar2) {
        return;
      }
      (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2d])
                (this,loc,"needs a literal integer","max_vertices","");
      return;
    }
    bVar1 = std::operator==(id,"stream");
    if (bVar1) {
      TParseVersions::requireProfile((TParseVersions *)this,loc,-9,"selecting output stream");
      *(ulong *)&(publicType->qualifier).field_0x1c =
           *(ulong *)&(publicType->qualifier).field_0x1c & 0xffffffffffffff |
           (ulong)local_4c << 0x38;
      if (0 < (int)local_4c) {
        TIntermediate::setMultiStream
                  ((this->super_TParseContextBase).super_TParseVersions.intermediate);
      }
      if (!bVar2) {
        return;
      }
      (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2d])
                (this,loc,"needs a literal integer","stream","");
      return;
    }
    break;
  case EShLangFragment:
    bVar1 = std::operator==(id,"index");
    if (bVar1) {
      TParseVersions::requireProfile
                ((TParseVersions *)this,loc,0xe,"index layout qualifier on fragment output");
      pcStack_c8 = "GL_ARB_separate_shader_objects";
      exts_2[0] = "GL_ARB_explicit_attrib_location";
      TParseVersions::profileRequires
                ((TParseVersions *)this,loc,6,0x14a,2,&stack0xffffffffffffff38,
                 "index layout qualifier on fragment output");
      TParseVersions::profileRequires
                ((TParseVersions *)this,loc,8,0x136,"GL_EXT_blend_func_extended",
                 "index layout qualifier on fragment output");
      if (((int)local_4c < 0) || (1 < (int)local_4c)) {
        local_4c = 0;
        (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2d])
                  (this,loc,"value must be 0 or 1","index","");
      }
      *(ulong *)&(publicType->qualifier).field_0x1c =
           *(ulong *)&(publicType->qualifier).field_0x1c & 0xff00ffffffffffff |
           ((ulong)local_4c & 0xff) << 0x30;
      if (!bVar2) {
        return;
      }
      (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2d])
                (this,loc,"needs a literal integer","index","");
      return;
    }
    break;
  case EShLangMesh:
    bVar1 = std::operator==(id,"max_vertices");
    if (bVar1) {
      (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[5])
                (this,loc,2,AEP_mesh_shader,"max_vertices");
      (publicType->shaderQualifiers).vertices = local_4c;
      uVar4 = (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[8])
                        (this,"GL_EXT_mesh_shader");
      if ((uVar4 & 1) == 0) {
        local_1ac = (this->resources).maxMeshOutputVerticesNV;
      }
      else {
        local_1ac = (this->resources).maxMeshOutputVerticesEXT;
      }
      maxsErrtring.field_2._12_4_ = local_1ac;
      if (local_1ac < (int)local_4c) {
        pool_allocator<char>::pool_allocator((pool_allocator<char> *)&stack0xffffffffffffff00);
        std::__cxx11::basic_string<char,std::char_traits<char>,glslang::std::allocator<char>>::
        basic_string<glslang::std::allocator<char>>
                  ((basic_string<char,std::char_traits<char>,glslang::std::allocator<char>> *)
                   local_f8,"too large, must be less than ",
                   (pool_allocator<char> *)&stack0xffffffffffffff00);
        uVar4 = (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[8])
                          (this,"GL_EXT_mesh_shader");
        pcVar6 = "gl_MaxMeshOutputVerticesNV";
        if ((uVar4 & 1) != 0) {
          pcVar6 = "gl_MaxMeshOutputVerticesEXT";
        }
        std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::
        append((basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_> *)
               local_f8,pcVar6);
        pcVar6 = std::__cxx11::
                 basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::c_str
                           ((basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>
                             *)local_f8);
        (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2d])
                  (this,loc,pcVar6,"max_vertices","");
        std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::
        ~basic_string((basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_> *)
                      local_f8);
      }
      if (!bVar2) {
        return;
      }
      (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2d])
                (this,loc,"needs a literal integer","max_vertices","");
      return;
    }
    bVar1 = std::operator==(id,"max_primitives");
    if (bVar1) {
      (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[5])
                (this,loc,2,AEP_mesh_shader,"max_primitives");
      (publicType->shaderQualifiers).primitives = local_4c;
      uVar4 = (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[8])
                        (this,"GL_EXT_mesh_shader");
      if ((uVar4 & 1) == 0) {
        local_1bc = (this->resources).maxMeshOutputPrimitivesNV;
      }
      else {
        local_1bc = (this->resources).maxMeshOutputPrimitivesEXT;
      }
      maxsErrtring_1.field_2._12_4_ = local_1bc;
      if (local_1bc < (int)local_4c) {
        pool_allocator<char>::pool_allocator(&local_138);
        std::__cxx11::basic_string<char,std::char_traits<char>,glslang::std::allocator<char>>::
        basic_string<glslang::std::allocator<char>>
                  ((basic_string<char,std::char_traits<char>,glslang::std::allocator<char>> *)
                   local_130,"too large, must be less than ",&local_138);
        uVar4 = (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[8])
                          (this,"GL_EXT_mesh_shader");
        pcVar6 = "gl_MaxMeshOutputPrimitivesNV";
        if ((uVar4 & 1) != 0) {
          pcVar6 = "gl_MaxMeshOutputPrimitivesEXT";
        }
        std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::
        append((basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_> *)
               local_130,pcVar6);
        pcVar6 = std::__cxx11::
                 basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::c_str
                           ((basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>
                             *)local_130);
        (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2d])
                  (this,loc,pcVar6,"max_primitives","");
        std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::
        ~basic_string((basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_> *)
                      local_130);
      }
      if (!bVar2) {
        return;
      }
      (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2d])
                (this,loc,"needs a literal integer","max_primitives","");
      return;
    }
  case EShLangCompute:
  case EShLangTask:
    iVar3 = std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>
            ::compare(id,0,0xb,"local_size_");
    if (iVar3 == 0) {
      if (((this->super_TParseContextBase).super_TParseVersions.language == EShLangMesh) ||
         ((this->super_TParseContextBase).super_TParseVersions.language == EShLangTask)) {
        (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[5])
                  (this,loc,2,AEP_mesh_shader,"gl_WorkGroupSize");
      }
      else {
        TParseVersions::profileRequires
                  ((TParseVersions *)this,loc,8,0x136,(char *)0x0,"gl_WorkGroupSize");
        TParseVersions::profileRequires
                  ((TParseVersions *)this,loc,-9,0x1ae,"GL_ARB_compute_shader","gl_WorkGroupSize");
      }
      if (bVar2) {
        (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2d])
                  (this,loc,"needs a literal integer","local_size","");
      }
      sVar5 = std::__cxx11::
              basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::size(id);
      if ((sVar5 == 0xc) && (local_4c == 0)) {
        pcVar6 = std::__cxx11::
                 basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::c_str
                           (id);
        (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2d])
                  (this,loc,"must be at least 1",pcVar6,"");
        return;
      }
      bVar2 = std::operator==(id,"local_size_x");
      if (bVar2) {
        (publicType->shaderQualifiers).localSize[0] = local_4c;
        (publicType->shaderQualifiers).localSizeNotDefault[0] = true;
        return;
      }
      bVar2 = std::operator==(id,"local_size_y");
      if (bVar2) {
        (publicType->shaderQualifiers).localSize[1] = local_4c;
        (publicType->shaderQualifiers).localSizeNotDefault[1] = true;
        return;
      }
      bVar2 = std::operator==(id,"local_size_z");
      if (bVar2) {
        (publicType->shaderQualifiers).localSize[2] = local_4c;
        (publicType->shaderQualifiers).localSizeNotDefault[2] = true;
        return;
      }
      if ((this->super_TParseContextBase).super_TParseVersions.spvVersion.spv != 0) {
        bVar2 = std::operator==(id,"local_size_x_id");
        if (bVar2) {
          (publicType->shaderQualifiers).localSizeSpecId[0] = local_4c;
          return;
        }
        bVar2 = std::operator==(id,"local_size_y_id");
        if (bVar2) {
          (publicType->shaderQualifiers).localSizeSpecId[1] = local_4c;
          return;
        }
        bVar2 = std::operator==(id,"local_size_z_id");
        if (bVar2) {
          (publicType->shaderQualifiers).localSizeSpecId[2] = local_4c;
          return;
        }
      }
    }
  }
  pcVar6 = std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>
           ::c_str(id);
  (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2d])
            (this,loc,"there is no such layout identifier for this stage taking an assigned value",
             pcVar6,"");
  return;
}

Assistant:

void TParseContext::setLayoutQualifier(const TSourceLoc& loc, TPublicType& publicType, TString& id, const TIntermTyped* node)
{
    const char* feature = "layout-id value";
    const char* nonLiteralFeature = "non-literal layout-id value";

    integerCheck(node, feature);
    const TIntermConstantUnion* constUnion = node->getAsConstantUnion();
    int value;
    bool nonLiteral = false;
    if (constUnion) {
        value = constUnion->getConstArray()[0].getIConst();
        if (! constUnion->isLiteral()) {
            requireProfile(loc, ECoreProfile | ECompatibilityProfile, nonLiteralFeature);
            profileRequires(loc, ECoreProfile | ECompatibilityProfile, 440, E_GL_ARB_enhanced_layouts, nonLiteralFeature);
        }
    } else {
        // grammar should have give out the error message
        value = 0;
        nonLiteral = true;
    }

    if (value < 0) {
        error(loc, "cannot be negative", feature, "");
        return;
    }

    std::transform(id.begin(), id.end(), id.begin(), ::tolower);

    if (id == "offset") {
        // "offset" can be for either
        //  - uniform offsets
        //  - atomic_uint offsets
        const char* feature = "offset";
        if (spvVersion.spv == 0) {
            requireProfile(loc, EEsProfile | ECoreProfile | ECompatibilityProfile, feature);
            const char* exts[2] = { E_GL_ARB_enhanced_layouts, E_GL_ARB_shader_atomic_counters };
            profileRequires(loc, ECoreProfile | ECompatibilityProfile, 420, 2, exts, feature);
            profileRequires(loc, EEsProfile, 310, nullptr, feature);
        }
        publicType.qualifier.layoutOffset = value;
        publicType.qualifier.explicitOffset = true;
        if (nonLiteral)
            error(loc, "needs a literal integer", "offset", "");
        return;
    } else if (id == "align") {
        const char* feature = "uniform buffer-member align";
        if (spvVersion.spv == 0) {
            requireProfile(loc, ECoreProfile | ECompatibilityProfile, feature);
            profileRequires(loc, ECoreProfile | ECompatibilityProfile, 440, E_GL_ARB_enhanced_layouts, feature);
        }
        // "The specified alignment must be a power of 2, or a compile-time error results."
        if (! IsPow2(value))
            error(loc, "must be a power of 2", "align", "");
        else
            publicType.qualifier.layoutAlign = value;
        if (nonLiteral)
            error(loc, "needs a literal integer", "align", "");
        return;
    } else if (id == "location") {
        profileRequires(loc, EEsProfile, 300, nullptr, "location");
        const char* exts[2] = { E_GL_ARB_separate_shader_objects, E_GL_ARB_explicit_attrib_location };
        // GL_ARB_explicit_uniform_location requires 330 or GL_ARB_explicit_attrib_location we do not need to add it here
        profileRequires(loc, ~EEsProfile, 330, 2, exts, "location");
        if ((unsigned int)value >= TQualifier::layoutLocationEnd)
            error(loc, "location is too large", id.c_str(), "");
        else
            publicType.qualifier.layoutLocation = value;
        if (nonLiteral)
            error(loc, "needs a literal integer", "location", "");
        return;
    } else if (id == "set") {
        if ((unsigned int)value >= TQualifier::layoutSetEnd)
            error(loc, "set is too large", id.c_str(), "");
        else
            publicType.qualifier.layoutSet = value;
        if (value != 0)
            requireVulkan(loc, "descriptor set");
        if (nonLiteral)
            error(loc, "needs a literal integer", "set", "");
        return;
    } else if (id == "binding") {
        profileRequires(loc, ~EEsProfile, 420, E_GL_ARB_shading_language_420pack, "binding");
        profileRequires(loc, EEsProfile, 310, nullptr, "binding");
        if ((unsigned int)value >= TQualifier::layoutBindingEnd)
            error(loc, "binding is too large", id.c_str(), "");
        else
            publicType.qualifier.layoutBinding = value;
        if (nonLiteral)
            error(loc, "needs a literal integer", "binding", "");
        return;
    }
    if (id == "constant_id") {
        requireSpv(loc, "constant_id");
        if (value >= (int)TQualifier::layoutSpecConstantIdEnd) {
            error(loc, "specialization-constant id is too large", id.c_str(), "");
        } else {
            publicType.qualifier.layoutSpecConstantId = value;
            publicType.qualifier.specConstant = true;
            if (! intermediate.addUsedConstantId(value))
                error(loc, "specialization-constant id already used", id.c_str(), "");
        }
        if (nonLiteral)
            error(loc, "needs a literal integer", "constant_id", "");
        return;
    }
    if (id == "component") {
        requireProfile(loc, ECoreProfile | ECompatibilityProfile, "component");
        profileRequires(loc, ECoreProfile | ECompatibilityProfile, 440, E_GL_ARB_enhanced_layouts, "component");
        if ((unsigned)value >= TQualifier::layoutComponentEnd)
            error(loc, "component is too large", id.c_str(), "");
        else
            publicType.qualifier.layoutComponent = value;
        if (nonLiteral)
            error(loc, "needs a literal integer", "component", "");
        return;
    }
    if (id.compare(0, 4, "xfb_") == 0) {
        // "Any shader making any static use (after preprocessing) of any of these
        // *xfb_* qualifiers will cause the shader to be in a transform feedback
        // capturing mode and hence responsible for describing the transform feedback
        // setup."
        intermediate.setXfbMode();
        const char* feature = "transform feedback qualifier";
        requireStage(loc, (EShLanguageMask)(EShLangVertexMask | EShLangGeometryMask | EShLangTessControlMask | EShLangTessEvaluationMask), feature);
        requireProfile(loc, ECoreProfile | ECompatibilityProfile, feature);
        profileRequires(loc, ECoreProfile | ECompatibilityProfile, 440, E_GL_ARB_enhanced_layouts, feature);
        if (id == "xfb_buffer") {
            // "It is a compile-time error to specify an *xfb_buffer* that is greater than
            // the implementation-dependent constant gl_MaxTransformFeedbackBuffers."
            if (value >= resources.maxTransformFeedbackBuffers)
                error(loc, "buffer is too large:", id.c_str(), "gl_MaxTransformFeedbackBuffers is %d", resources.maxTransformFeedbackBuffers);
            if (value >= (int)TQualifier::layoutXfbBufferEnd)
                error(loc, "buffer is too large:", id.c_str(), "internal max is %d", TQualifier::layoutXfbBufferEnd-1);
            else
                publicType.qualifier.layoutXfbBuffer = value;
            if (nonLiteral)
                error(loc, "needs a literal integer", "xfb_buffer", "");
            return;
        } else if (id == "xfb_offset") {
            if (value >= (int)TQualifier::layoutXfbOffsetEnd)
                error(loc, "offset is too large:", id.c_str(), "internal max is %d", TQualifier::layoutXfbOffsetEnd-1);
            else
                publicType.qualifier.layoutXfbOffset = value;
            if (nonLiteral)
                error(loc, "needs a literal integer", "xfb_offset", "");
            return;
        } else if (id == "xfb_stride") {
            // "The resulting stride (implicit or explicit), when divided by 4, must be less than or equal to the
            // implementation-dependent constant gl_MaxTransformFeedbackInterleavedComponents."
            if (value > 4 * resources.maxTransformFeedbackInterleavedComponents) {
                error(loc, "1/4 stride is too large:", id.c_str(), "gl_MaxTransformFeedbackInterleavedComponents is %d",
                    resources.maxTransformFeedbackInterleavedComponents);
            }
            if (value >= (int)TQualifier::layoutXfbStrideEnd)
                error(loc, "stride is too large:", id.c_str(), "internal max is %d", TQualifier::layoutXfbStrideEnd-1);
            else
                publicType.qualifier.layoutXfbStride = value;
            if (nonLiteral)
                error(loc, "needs a literal integer", "xfb_stride", "");
            return;
        }
    }
    if (id == "input_attachment_index") {
        requireVulkan(loc, "input_attachment_index");
        if (value >= (int)TQualifier::layoutAttachmentEnd)
            error(loc, "attachment index is too large", id.c_str(), "");
        else
            publicType.qualifier.layoutAttachment = value;
        if (nonLiteral)
            error(loc, "needs a literal integer", "input_attachment_index", "");
        return;
    }
    if (id == "num_views") {
        requireExtensions(loc, Num_OVR_multiview_EXTs, OVR_multiview_EXTs, "num_views");
        publicType.shaderQualifiers.numViews = value;
        if (nonLiteral)
            error(loc, "needs a literal integer", "num_views", "");
        return;
    }
    if (language == EShLangVertex ||
        language == EShLangTessControl ||
        language == EShLangTessEvaluation ||
        language == EShLangGeometry) {
        if (id == "secondary_view_offset") {
            requireExtensions(loc, 1, &E_GL_NV_stereo_view_rendering, "stereo view rendering");
            publicType.qualifier.layoutSecondaryViewportRelativeOffset = value;
            if (nonLiteral)
                error(loc, "needs a literal integer", "secondary_view_offset", "");
            return;
        }
    }

    if (id == "buffer_reference_align") {
        requireExtensions(loc, 1, &E_GL_EXT_buffer_reference, "buffer_reference_align");
        if (! IsPow2(value))
            error(loc, "must be a power of 2", "buffer_reference_align", "");
        else
            publicType.qualifier.layoutBufferReferenceAlign = IntLog2(value);
        if (nonLiteral)
            error(loc, "needs a literal integer", "buffer_reference_align", "");
        return;
    }

    switch (language) {
    case EShLangTessControl:
        if (id == "vertices") {
            if (value == 0)
                error(loc, "must be greater than 0", "vertices", "");
            else
                publicType.shaderQualifiers.vertices = value;
            if (nonLiteral)
                error(loc, "needs a literal integer", "vertices", "");
            return;
        }
        break;

    case EShLangGeometry:
        if (id == "invocations") {
            profileRequires(loc, ECompatibilityProfile | ECoreProfile, 400, nullptr, "invocations");
            if (value == 0)
                error(loc, "must be at least 1", "invocations", "");
            else
                publicType.shaderQualifiers.invocations = value;
            if (nonLiteral)
                error(loc, "needs a literal integer", "invocations", "");
            return;
        }
        if (id == "max_vertices") {
            publicType.shaderQualifiers.vertices = value;
            if (value > resources.maxGeometryOutputVertices)
                error(loc, "too large, must be less than gl_MaxGeometryOutputVertices", "max_vertices", "");
            if (nonLiteral)
                error(loc, "needs a literal integer", "max_vertices", "");
            return;
        }
        if (id == "stream") {
            requireProfile(loc, ~EEsProfile, "selecting output stream");
            publicType.qualifier.layoutStream = value;
            if (value > 0)
                intermediate.setMultiStream();
            if (nonLiteral)
                error(loc, "needs a literal integer", "stream", "");
            return;
        }
        break;

    case EShLangFragment:
        if (id == "index") {
            requireProfile(loc, ECompatibilityProfile | ECoreProfile | EEsProfile, "index layout qualifier on fragment output");
            const char* exts[2] = { E_GL_ARB_separate_shader_objects, E_GL_ARB_explicit_attrib_location };
            profileRequires(loc, ECompatibilityProfile | ECoreProfile, 330, 2, exts, "index layout qualifier on fragment output");
            profileRequires(loc, EEsProfile ,310, E_GL_EXT_blend_func_extended, "index layout qualifier on fragment output");
            // "It is also a compile-time error if a fragment shader sets a layout index to less than 0 or greater than 1."
            if (value < 0 || value > 1) {
                value = 0;
                error(loc, "value must be 0 or 1", "index", "");
            }

            publicType.qualifier.layoutIndex = value;
            if (nonLiteral)
                error(loc, "needs a literal integer", "index", "");
            return;
        }
        break;

    case EShLangMesh:
        if (id == "max_vertices") {
            requireExtensions(loc, Num_AEP_mesh_shader, AEP_mesh_shader, "max_vertices");
            publicType.shaderQualifiers.vertices = value;
            int max = extensionTurnedOn(E_GL_EXT_mesh_shader) ? resources.maxMeshOutputVerticesEXT
                                                              : resources.maxMeshOutputVerticesNV;
            if (value > max) {
                TString maxsErrtring = "too large, must be less than ";
                maxsErrtring.append(extensionTurnedOn(E_GL_EXT_mesh_shader) ? "gl_MaxMeshOutputVerticesEXT"
                                                                            : "gl_MaxMeshOutputVerticesNV");
                error(loc, maxsErrtring.c_str(), "max_vertices", "");
            }
            if (nonLiteral)
                error(loc, "needs a literal integer", "max_vertices", "");
            return;
        }
        if (id == "max_primitives") {
            requireExtensions(loc, Num_AEP_mesh_shader, AEP_mesh_shader, "max_primitives");
            publicType.shaderQualifiers.primitives = value;
            int max = extensionTurnedOn(E_GL_EXT_mesh_shader) ? resources.maxMeshOutputPrimitivesEXT
                                                              : resources.maxMeshOutputPrimitivesNV;
            if (value > max) {
                TString maxsErrtring = "too large, must be less than ";
                maxsErrtring.append(extensionTurnedOn(E_GL_EXT_mesh_shader) ? "gl_MaxMeshOutputPrimitivesEXT"
                                                                            : "gl_MaxMeshOutputPrimitivesNV");
                error(loc, maxsErrtring.c_str(), "max_primitives", "");
            }
            if (nonLiteral)
                error(loc, "needs a literal integer", "max_primitives", "");
            return;
        }
        [[fallthrough]];

    case EShLangTask:
        // Fall through
    case EShLangCompute:
        if (id.compare(0, 11, "local_size_") == 0) {
            if (language == EShLangMesh || language == EShLangTask) {
                requireExtensions(loc, Num_AEP_mesh_shader, AEP_mesh_shader, "gl_WorkGroupSize");
            } else {
                profileRequires(loc, EEsProfile, 310, nullptr, "gl_WorkGroupSize");
                profileRequires(loc, ~EEsProfile, 430, E_GL_ARB_compute_shader, "gl_WorkGroupSize");
            }
            if (nonLiteral)
                error(loc, "needs a literal integer", "local_size", "");
            if (id.size() == 12 && value == 0) {
                error(loc, "must be at least 1", id.c_str(), "");
                return;
            }
            if (id == "local_size_x") {
                publicType.shaderQualifiers.localSize[0] = value;
                publicType.shaderQualifiers.localSizeNotDefault[0] = true;
                return;
            }
            if (id == "local_size_y") {
                publicType.shaderQualifiers.localSize[1] = value;
                publicType.shaderQualifiers.localSizeNotDefault[1] = true;
                return;
            }
            if (id == "local_size_z") {
                publicType.shaderQualifiers.localSize[2] = value;
                publicType.shaderQualifiers.localSizeNotDefault[2] = true;
                return;
            }
            if (spvVersion.spv != 0) {
                if (id == "local_size_x_id") {
                    publicType.shaderQualifiers.localSizeSpecId[0] = value;
                    return;
                }
                if (id == "local_size_y_id") {
                    publicType.shaderQualifiers.localSizeSpecId[1] = value;
                    return;
                }
                if (id == "local_size_z_id") {
                    publicType.shaderQualifiers.localSizeSpecId[2] = value;
                    return;
                }
            }
        }
        break;

    default:
        break;
    }

    error(loc, "there is no such layout identifier for this stage taking an assigned value", id.c_str(), "");
}